

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O3

GLFWEvent * glfwEventPush(void)

{
  GLFWEvent *pGVar1;
  GLFWEvent **ppGVar2;
  
  if (GLFWEventPool == (GLFWEvent *)0x0) {
    if (GLFWEventPoolSize != 0) {
      __assert_fail("GLFWEventPoolSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/creationix[P]lit-glfw/wrapper.c"
                    ,0x2d,"GLFWEvent *glfwEventPush()");
    }
    pGVar1 = (GLFWEvent *)malloc(0x28);
  }
  else {
    GLFWEventPoolSize = GLFWEventPoolSize + -1;
    pGVar1 = GLFWEventPool;
    GLFWEventPool = GLFWEventPool->next;
  }
  pGVar1->next = (GLFWEvent *)0x0;
  ppGVar2 = &GLFWEventHead;
  if (GLFWEventTail != (GLFWEvent *)0x0) {
    ppGVar2 = &GLFWEventTail->next;
  }
  ((GLFWEvent *)ppGVar2)->next = pGVar1;
  GLFWEventTail = pGVar1;
  return pGVar1;
}

Assistant:

static GLFWEvent* glfwEventPush() {
  GLFWEvent* event;
  // If there is an old event in the pool, reuse it.
  if (GLFWEventPool) {
    GLFWEventPoolSize--;
    event = GLFWEventPool;
    GLFWEventPool = event->next;
  }
  // Otherwise allocate a new event.
  else {
    assert(GLFWEventPoolSize == 0);
    event = malloc(sizeof(*event));
  }
  event->next = NULL;
  if (GLFWEventTail) {
    GLFWEventTail->next = event;
  }
  else {
   GLFWEventHead = event;
  }
  GLFWEventTail = event;
  return event;
}